

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
llvm::
DenseMap<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>
::copyFrom(DenseMap<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>
           *this,DenseMap<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>
                 *other)

{
  bool bVar1;
  
  operator_delete(this->Buckets,(ulong)this->NumBuckets * 0x50,8);
  bVar1 = allocateBuckets(this,other->NumBuckets);
  if (bVar1) {
    DenseMapBase<llvm::DenseMap<unsigned_long,llvm::RelocAddrEntry,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::RelocAddrEntry>>,unsigned_long,llvm::RelocAddrEntry,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::RelocAddrEntry>>
    ::
    copyFrom<llvm::DenseMap<unsigned_long,llvm::RelocAddrEntry,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::RelocAddrEntry>>>
              ((DenseMapBase<llvm::DenseMap<unsigned_long,llvm::RelocAddrEntry,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::RelocAddrEntry>>,unsigned_long,llvm::RelocAddrEntry,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::RelocAddrEntry>>
                *)this,(DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>,_unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>
                        *)other);
    return;
  }
  this->NumEntries = 0;
  this->NumTombstones = 0;
  return;
}

Assistant:

void copyFrom(const DenseMap& other) {
    this->destroyAll();
    deallocate_buffer(Buckets, sizeof(BucketT) * NumBuckets, alignof(BucketT));
    if (allocateBuckets(other.NumBuckets)) {
      this->BaseT::copyFrom(other);
    } else {
      NumEntries = 0;
      NumTombstones = 0;
    }
  }